

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3GetReverseVarint(char **pp,char *pStart,sqlite3_int64 *pVal)

{
  bool bVar1;
  char *local_30;
  char *p;
  sqlite3_int64 iVal;
  sqlite3_int64 *pVal_local;
  char *pStart_local;
  char **pp_local;
  
  local_30 = *pp + -2;
  while( true ) {
    bVar1 = false;
    if (pStart <= local_30) {
      bVar1 = ((int)*local_30 & 0x80U) != 0;
    }
    if (!bVar1) break;
    local_30 = local_30 + -1;
  }
  *pp = local_30 + 1;
  iVal = (sqlite3_int64)pVal;
  pVal_local = (sqlite3_int64 *)pStart;
  pStart_local = (char *)pp;
  sqlite3Fts3GetVarint(local_30 + 1,(sqlite_int64 *)&p);
  *(char **)iVal = p;
  return;
}

Assistant:

static void fts3GetReverseVarint(
  char **pp, 
  char *pStart, 
  sqlite3_int64 *pVal
){
  sqlite3_int64 iVal;
  char *p;

  /* Pointer p now points at the first byte past the varint we are 
  ** interested in. So, unless the doclist is corrupt, the 0x80 bit is
  ** clear on character p[-1]. */
  for(p = (*pp)-2; p>=pStart && *p&0x80; p--);
  p++;
  *pp = p;

  sqlite3Fts3GetVarint(p, &iVal);
  *pVal = iVal;
}